

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_greedy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pInLimit;
  BYTE *pBVar1;
  undefined8 *puVar2;
  BYTE *pBVar3;
  char cVar4;
  undefined8 uVar5;
  U32 lowestValid;
  seqDef *psVar6;
  size_t sVar7;
  long lVar8;
  BYTE *litEnd;
  int *ip;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  U32 UVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int *ilimit_w;
  uint local_9c;
  size_t offbaseFound;
  seqStore_t *local_88;
  BYTE *local_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  size_t local_68;
  int *local_60;
  BYTE *litLimit_w;
  BYTE *local_50;
  int *local_48;
  uint *local_40;
  ZSTD_matchState_t *local_38;
  
  local_80 = (ms->window).base;
  uVar10 = (ms->window).dictLimit;
  local_50 = local_80 + uVar10;
  uVar9 = (ms->cParams).minMatch;
  if (5 < uVar9) {
    uVar9 = 6;
  }
  if (uVar9 < 5) {
    uVar9 = 4;
  }
  local_6c = (ms->cParams).searchLog;
  uVar19 = 6;
  if (local_6c < 6) {
    uVar19 = local_6c;
  }
  if (uVar19 < 5) {
    uVar19 = 4;
  }
  ip = (int *)((ulong)((int)src == (int)local_50) + (long)src);
  iVar13 = (int)ip - (int)local_80;
  uVar12 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  local_74 = *rep;
  local_70 = iVar13 - uVar12;
  if (iVar13 - uVar10 <= uVar12) {
    local_70 = uVar10;
  }
  if (ms->loadedDictEnd != 0) {
    local_70 = uVar10;
  }
  local_78 = rep[1];
  ms->lazySkipping = 0;
  local_70 = iVar13 - local_70;
  local_60 = (int *)((long)src + (srcSize - 0x10));
  uVar10 = ms->nextToUpdate;
  uVar11 = (ulong)uVar10;
  uVar12 = ((int)local_60 - (int)(local_80 + uVar11)) + 1;
  if (7 < uVar12) {
    uVar12 = 8;
  }
  uVar15 = 0;
  if (local_80 + uVar11 <= local_60) {
    uVar15 = uVar12;
  }
  cVar4 = (char)ms->rowHashLog;
  pInLimit = (BYTE *)((long)src + srcSize);
  for (; uVar11 < uVar15 + uVar10; uVar11 = uVar11 + 1) {
    if (uVar9 == 5) {
      uVar16 = *(long *)(local_80 + uVar11) * -0x30e4432345000000;
LAB_00f3c6d8:
      UVar14 = (U32)((uVar16 ^ ms->hashSalt) >> (0x38U - cVar4 & 0x3f));
    }
    else {
      if (uVar9 == 6) {
        uVar16 = *(long *)(local_80 + uVar11) * -0x30e4432340650000;
        goto LAB_00f3c6d8;
      }
      UVar14 = (*(int *)(local_80 + uVar11) * -0x61c8864f ^ (uint)ms->hashSalt) >>
               (0x18U - cVar4 & 0x1f);
    }
    ms->hashCache[(uint)uVar11 & 7] = UVar14;
  }
  local_9c = local_78;
  if (local_70 < local_78) {
    local_9c = 0;
  }
  uVar11 = (ulong)local_74;
  if (local_70 < local_74) {
    uVar11 = 0;
  }
  ilimit_w = (int *)(pInLimit + -0x20);
  local_88 = seqStore;
  litLimit_w = (BYTE *)ilimit_w;
  local_40 = rep;
  local_38 = ms;
  do {
    uVar10 = (uint)uVar11;
    local_68 = -uVar11;
    while( true ) {
      if (local_60 <= ip) {
        if (local_78 <= local_70) {
          local_78 = 0;
        }
        uVar9 = local_78;
        if (uVar10 != 0) {
          uVar9 = local_74;
        }
        if (local_74 <= local_70) {
          uVar9 = local_78;
          local_74 = 0;
        }
        if (uVar10 != 0) {
          local_74 = uVar10;
        }
        if (local_9c != 0) {
          uVar9 = local_9c;
        }
        *local_40 = local_74;
        local_40[1] = uVar9;
        return (long)pInLimit - (long)src;
      }
      if ((uVar10 != 0) && (*(int *)((long)ip + local_68 + 1) == *(int *)((long)ip + 1))) {
        local_48 = (int *)((long)ip + 1);
        sVar7 = ZSTD_count((BYTE *)((long)ip + 5),(BYTE *)((long)ip + local_68 + 5),pInLimit);
        uVar16 = sVar7 + 4;
        sVar7 = 1;
        ip = local_48;
        goto LAB_00f3c960;
      }
      offbaseFound = 999999999;
      if (uVar9 == 6) {
        if (uVar19 == 6) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
        else if (uVar19 == 5) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
        else {
          uVar16 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
      }
      else if (uVar9 == 5) {
        if (uVar19 == 6) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
        else if (uVar19 == 5) {
          uVar16 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
        else {
          uVar16 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)ip,pInLimit,&offbaseFound);
        }
      }
      else if (uVar19 == 6) {
        uVar16 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)ip,pInLimit,&offbaseFound);
      }
      else if (uVar19 == 5) {
        uVar16 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)ip,pInLimit,&offbaseFound);
      }
      else {
        uVar16 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)ip,pInLimit,&offbaseFound);
      }
      if (3 < uVar16) break;
      uVar16 = (long)ip - (long)src;
      ip = (int *)((long)ip + (uVar16 >> 8) + 1);
      ms->lazySkipping = (uint)(0x7ff < uVar16);
    }
    sVar7 = offbaseFound;
    if (3 < offbaseFound) {
      for (; ((src < ip && (local_50 < (BYTE *)((long)ip + (3 - offbaseFound)))) &&
             (*(char *)((long)ip + -1) == *(char *)((long)ip + (2 - offbaseFound))));
          ip = (int *)((long)ip + -1)) {
        uVar16 = uVar16 + 1;
      }
      uVar11 = (ulong)((int)offbaseFound - 3);
      local_9c = uVar10;
    }
LAB_00f3c960:
    uVar18 = (long)ip - (long)src;
    pBVar3 = local_88->lit;
    if (ilimit_w < ip) {
      local_68 = sVar7;
      ZSTD_safecopyLiterals(pBVar3,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
      sVar7 = local_68;
LAB_00f3c997:
      local_88->lit = local_88->lit + uVar18;
      psVar6 = local_88->sequences;
      if (0xffff < uVar18) {
        local_88->longLengthType = ZSTD_llt_literalLength;
        local_88->longLengthPos = (U32)((ulong)((long)psVar6 - (long)local_88->sequencesStart) >> 3)
        ;
      }
    }
    else {
      uVar5 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar3 = *src;
      *(undefined8 *)(pBVar3 + 8) = uVar5;
      pBVar3 = local_88->lit;
      if (0x10 < uVar18) {
        uVar5 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar3 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar3 + 0x18) = uVar5;
        if (0x20 < (long)uVar18) {
          lVar8 = 0;
          do {
            puVar2 = (undefined8 *)((long)src + lVar8 + 0x20);
            uVar5 = puVar2[1];
            pBVar1 = pBVar3 + lVar8 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar5;
            puVar2 = (undefined8 *)((long)src + lVar8 + 0x30);
            uVar5 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar5;
            lVar8 = lVar8 + 0x20;
          } while (pBVar1 + 0x20 < pBVar3 + uVar18);
        }
        goto LAB_00f3c997;
      }
      local_88->lit = pBVar3 + uVar18;
      psVar6 = local_88->sequences;
    }
    psVar6->litLength = (U16)uVar18;
    psVar6->offBase = (U32)sVar7;
    if (0xffff < uVar16 - 3) {
      local_88->longLengthType = ZSTD_llt_matchLength;
      local_88->longLengthPos = (U32)((ulong)((long)psVar6 - (long)local_88->sequencesStart) >> 3);
    }
    psVar6->mlBase = (U16)(uVar16 - 3);
    local_88->sequences = psVar6 + 1;
    if (ms->lazySkipping != 0) {
      uVar10 = ms->nextToUpdate;
      uVar18 = (ulong)uVar10;
      uVar12 = ((int)local_60 - (int)(local_80 + uVar18)) + 1;
      if (7 < uVar12) {
        uVar12 = 8;
      }
      if (local_60 < local_80 + uVar18) {
        uVar12 = 0;
      }
      cVar4 = (char)ms->rowHashLog;
      for (; uVar18 < uVar12 + uVar10; uVar18 = uVar18 + 1) {
        if (uVar9 == 5) {
          uVar17 = *(long *)(local_80 + uVar18) * -0x30e4432345000000;
LAB_00f3cb0b:
          uVar15 = (uint)((uVar17 ^ ms->hashSalt) >> (0x38U - cVar4 & 0x3f));
        }
        else {
          if (uVar9 == 6) {
            uVar17 = *(long *)(local_80 + uVar18) * -0x30e4432340650000;
            goto LAB_00f3cb0b;
          }
          uVar15 = (*(int *)(local_80 + uVar18) * -0x61c8864f ^ (uint)ms->hashSalt) >>
                   (0x18U - cVar4 & 0x1f);
        }
        ms->hashCache[(uint)uVar18 & 7] = uVar15;
      }
      ms->lazySkipping = 0;
      ilimit_w = (int *)litLimit_w;
    }
    for (ip = (int *)((long)ip + uVar16);
        ((src = ip, local_9c != 0 && (ip <= local_60)) &&
        (*ip == *(int *)((long)ip - (ulong)local_9c))); ip = (int *)((long)ip + sVar7 + 4)) {
      sVar7 = ZSTD_count((BYTE *)(ip + 1),(BYTE *)((long)ip + (4 - (ulong)local_9c)),pInLimit);
      pBVar3 = local_88->lit;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar3,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar3 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar3 + 8) = uVar5;
      }
      uVar10 = (uint)uVar11;
      psVar6 = local_88->sequences;
      psVar6->litLength = 0;
      psVar6->offBase = 1;
      if (0xffff < sVar7 + 1) {
        local_88->longLengthType = ZSTD_llt_matchLength;
        local_88->longLengthPos = (U32)((ulong)((long)psVar6 - (long)local_88->sequencesStart) >> 3)
        ;
      }
      psVar6->mlBase = (U16)(sVar7 + 1);
      local_88->sequences = psVar6 + 1;
      uVar11 = (ulong)local_9c;
      ilimit_w = (int *)litLimit_w;
      ms = local_38;
      local_9c = uVar10;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_noDict);
}